

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

void * lua_upvalueid(lua_State *L,int idx,int n)

{
  TValue *pTVar1;
  void *pvVar2;
  ulong uVar3;
  
  pTVar1 = index2adr(L,idx);
  uVar3 = pTVar1->u64 & 0x7fffffffffff;
  if (*(char *)(uVar3 + 10) == '\0') {
    pvVar2 = *(void **)(uVar3 + 0x28 + (long)(n + -1) * 8);
  }
  else {
    pvVar2 = (void *)(uVar3 + (long)(n + -1) * 8 + 0x30);
  }
  return pvVar2;
}

Assistant:

LUA_API void *lua_upvalueid(lua_State *L, int idx, int n)
{
  GCfunc *fn = funcV(index2adr(L, idx));
  n--;
  lj_checkapi((uint32_t)n < fn->l.nupvalues, "bad upvalue %d", n);
  return isluafunc(fn) ? (void *)gcref(fn->l.uvptr[n]) :
			 (void *)&fn->c.upvalue[n];
}